

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier_test.cpp
# Opt level: O0

void __thiscall BarrierTest_ArriveCompletion_Test::TestBody(BarrierTest_ArriveCompletion_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_2c0;
  Message local_2b8;
  int local_2ac;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_278;
  Message local_270 [6];
  exception *e_2;
  undefined1 auStack_238 [8];
  TrueWithString gtest_msg_2;
  AssertHelper local_210;
  Message local_208;
  int local_1fc;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_1c8;
  Message local_1c0 [6];
  exception *e_1;
  undefined1 auStack_188 [8];
  TrueWithString gtest_msg_1;
  AssertHelper local_160;
  Message local_158;
  int local_14c;
  undefined1 local_148 [8];
  AssertionResult gtest_ar;
  AssertHelper local_118;
  Message local_110 [6];
  exception *e;
  uint local_d8;
  undefined1 auStack_c8 [8];
  TrueWithString gtest_msg;
  undefined1 local_98 [8];
  barrier<counting_completion> barrier;
  counting_completion complation;
  int counter;
  BarrierTest_ArriveCompletion_Test *this_local;
  
  complation.counter._4_4_ = 0;
  barrier.mtx_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)((long)&complation.counter + 4);
  yamc::barrier<counting_completion>::barrier
            ((barrier<counting_completion> *)local_98,2,
             (counting_completion)barrier.mtx_.super___mutex_base._M_mutex.__data.__list.__next);
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_c8 = (undefined1  [8])0x0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_c8);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_c8);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_d8 = (uint)yamc::barrier<counting_completion>::arrive
                                 ((barrier<counting_completion> *)local_98,1);
    }
  }
  else {
    testing::Message::Message(local_110);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &gtest_ar.message_,
                   "Expected: (void)barrier.arrive() doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_c8);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/barrier_test.cpp"
               ,0x51,pcVar2);
    testing::internal::AssertHelper::operator=(&local_118,local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_110);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_c8);
  local_14c = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_148,"counter","0",(int *)((long)&complation.counter + 4),&local_14c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/barrier_test.cpp"
               ,0x52,pcVar2);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  gtest_msg_1.value._M_string_length = 0;
  gtest_msg_1.value.field_2._M_allocated_capacity = 0;
  auStack_188 = (undefined1  [8])0x0;
  gtest_msg_1.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg_1.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_188);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_188);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      e_1._4_4_ = yamc::barrier<counting_completion>::arrive
                            ((barrier<counting_completion> *)local_98,1);
    }
  }
  else {
    testing::Message::Message(local_1c0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &gtest_ar_1.message_,
                   "Expected: (void)barrier.arrive() doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_188)
    ;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/barrier_test.cpp"
               ,0x53,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c8,local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(local_1c0);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_188);
  local_1fc = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1f8,"counter","1",(int *)((long)&complation.counter + 4),&local_1fc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/barrier_test.cpp"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=(&local_210,&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  gtest_msg_2.value._M_string_length = 0;
  gtest_msg_2.value.field_2._M_allocated_capacity = 0;
  auStack_238 = (undefined1  [8])0x0;
  gtest_msg_2.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg_2.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_238);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_238);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      e_2._4_4_ = yamc::barrier<counting_completion>::arrive
                            ((barrier<counting_completion> *)local_98,2);
    }
  }
  else {
    testing::Message::Message(local_270);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &gtest_ar_2.message_,
                   "Expected: (void)barrier.arrive(2) doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_238)
    ;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/barrier_test.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=(&local_278,local_270);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(local_270);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_238);
  local_2ac = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_2a8,"counter","2",(int *)((long)&complation.counter + 4),&local_2ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar1) {
    testing::Message::Message(&local_2b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/barrier_test.cpp"
               ,0x56,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  yamc::barrier<counting_completion>::~barrier((barrier<counting_completion> *)local_98);
  return;
}

Assistant:

TEST(BarrierTest, ArriveCompletion)
{
  int counter = 0;
  counting_completion complation{&counter};
  yamc::barrier<counting_completion> barrier{2, complation};  // expected count=2
  EXPECT_NO_THROW((void)barrier.arrive());   // c=2->1
  EXPECT_EQ(counter, 0);
  EXPECT_NO_THROW((void)barrier.arrive());   // c=1->0, call completion
  EXPECT_EQ(counter, 1);
  EXPECT_NO_THROW((void)barrier.arrive(2));  // c=2->0, call completion
  EXPECT_EQ(counter, 2);
}